

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall blc::network::Client::Client(Client *this,int socket,sockaddr_in addr)

{
  char *pcVar1;
  char *__s;
  
  Socket::Socket(&this->super_Socket);
  (this->super_Socket).super_stream._vptr_stream = (_func_int **)&PTR_write_0011a9b0;
  (this->super_Socket)._socket = socket;
  __s = inet_ntoa((in_addr_t)addr.sin_addr.s_addr);
  pcVar1 = (char *)(this->super_Socket)._address._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&(this->super_Socket)._address,0,pcVar1,(ulong)__s);
  (this->super_Socket)._port = (uint)(ushort)(addr.sin_port << 8 | addr.sin_port >> 8);
  (this->super_Socket)._opened = true;
  return;
}

Assistant:

blc::network::Client::Client(int socket, struct sockaddr_in addr) : Socket() {
	struct sockaddr_in data;

	data = *((struct sockaddr_in*)(&addr));
	this->_socket = socket;
	this->_address = inet_ntoa(data.sin_addr);
	this->_port = ntohs(data.sin_port);
	this->_opened = true;
}